

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

void Jf_ManPropagateEla(Jf_Man_t *p,int fEdge)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int CostAft;
  int CostBef;
  int i;
  Gia_Obj_t *pObj;
  int fEdge_local;
  Jf_Man_t *p_local;
  
  p->pPars->Clause = 0;
  p->pPars->Edge = 0;
  p->pPars->Area = 0;
  CostAft = p->pGia->nObjs;
  while( true ) {
    CostAft = CostAft + -1;
    bVar4 = false;
    if (-1 < CostAft) {
      _CostBef = Gia_ManObj(p->pGia,CostAft);
      bVar4 = _CostBef != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar2 = Gia_ObjIsBuf(_CostBef);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsAnd(_CostBef);
      if ((iVar2 != 0) && (iVar2 = Gia_ObjRefNum(p->pGia,_CostBef), 0 < iVar2)) {
        iVar2 = Jf_ObjIsUnit(_CostBef);
        if (iVar2 == 0) {
          __assert_fail("Jf_ObjIsUnit(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                        ,0x578,"void Jf_ManPropagateEla(Jf_Man_t *, int)");
        }
        piVar3 = Jf_ObjCutBest(p,CostAft);
        iVar2 = Jf_CutCheckMffc(p,piVar3,0x32);
        if (iVar2 != 0) {
          piVar3 = Jf_ObjCutBest(p,CostAft);
          iVar2 = Jf_CutDeref_rec(p,piVar3);
          Jf_ObjComputeBestCut(p,_CostBef,fEdge,1);
          piVar3 = Jf_ObjCutBest(p,CostAft);
          iVar1 = Jf_CutRef_rec(p,piVar3);
          if (iVar2 < iVar1) {
            __assert_fail("CostBef >= CostAft",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                          ,0x57f,"void Jf_ManPropagateEla(Jf_Man_t *, int)");
          }
        }
        if (p->pPars->fGenCnf != 0) {
          piVar3 = Jf_ObjCutBest(p,CostAft);
          iVar2 = Jf_CutCnfSize(p,piVar3);
          p->pPars->Clause = (long)iVar2 + p->pPars->Clause;
        }
        piVar3 = Jf_ObjCutBest(p,CostAft);
        iVar2 = Jf_CutSize(piVar3);
        p->pPars->Edge = (long)iVar2 + p->pPars->Edge;
        p->pPars->Area = p->pPars->Area + 1;
      }
    }
    else {
      Jf_ObjPropagateBuf(p,_CostBef,1);
    }
  }
  iVar2 = Jf_ManComputeDelay(p,1);
  p->pPars->Delay = (long)iVar2;
  return;
}

Assistant:

void Jf_ManPropagateEla( Jf_Man_t * p, int fEdge )
{
    Gia_Obj_t * pObj; 
    int i, CostBef, CostAft;
    p->pPars->Area = p->pPars->Edge = p->pPars->Clause = 0;
    Gia_ManForEachObjReverse( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Jf_ObjPropagateBuf( p, pObj, 1 );
        else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
        {
            assert( Jf_ObjIsUnit(pObj) );
            if ( Jf_CutCheckMffc(p, Jf_ObjCutBest(p, i), 50) )
            {
                CostBef = Jf_CutDeref_rec( p, Jf_ObjCutBest(p, i) );
                Jf_ObjComputeBestCut( p, pObj, fEdge, 1 );
                CostAft = Jf_CutRef_rec( p, Jf_ObjCutBest(p, i) );
    //            if ( CostBef != CostAft )  printf( "%d -> %d   ", CostBef, CostAft );
                assert( CostBef >= CostAft ); // does not hold because of JF_EDGE_LIM
            }
            if ( p->pPars->fGenCnf )
            p->pPars->Clause += Jf_CutCnfSize(p, Jf_ObjCutBest(p, i));
            p->pPars->Edge += Jf_CutSize(Jf_ObjCutBest(p, i));
            p->pPars->Area++;
        }
    p->pPars->Delay = Jf_ManComputeDelay( p, 1 );
//    printf( "\n" );
}